

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

Image * vera::toSdf(Image *__return_storage_ptr__,Mesh *_mesh,float _paddingPct,int _resolution)

{
  double dVar1;
  double dVar2;
  int iVar3;
  undefined8 uVar4;
  pointer ptVar5;
  int iVar6;
  int iVar7;
  size_t _width;
  int iVar8;
  thread *t_1;
  pointer ptVar9;
  int iVar10;
  int iVar11;
  float fVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar13;
  thread t;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  BVH acc;
  vector<vera::Triangle,_std::allocator<vera::Triangle>_> tris;
  Mesh mesh;
  long *local_1d0;
  thread local_1c8;
  int local_1c0;
  float local_1bc;
  undefined1 local_1b8 [16];
  vector<std::thread,_std::allocator<std::thread>_> local_1a8;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  BVH local_168;
  vector<vera::Triangle,_std::allocator<vera::Triangle>_> local_100;
  undefined8 local_e8;
  undefined8 uStack_e0;
  Mesh local_d8;
  
  Mesh::Mesh(&local_d8,_mesh);
  center(&local_d8.m_vertices);
  Mesh::getTriangles(&local_100,&local_d8);
  BVH::BVH(&local_168,&local_100,SPLIT_MIDPOINT);
  BoundingBox::square(&local_168.super_BoundingBox);
  fVar12 = local_168.super_BoundingBox.max.field_0.x - local_168.super_BoundingBox.min.field_0.x;
  fVar13 = local_168.super_BoundingBox.max.field_1.y - local_168.super_BoundingBox.min.field_1.y;
  local_1bc = local_168.super_BoundingBox.max.field_2.z - local_168.super_BoundingBox.min.field_2.z;
  local_178 = ZEXT416((uint)fVar12);
  fVar12 = local_1bc * local_1bc + fVar13 * fVar13 + fVar12 * fVar12;
  local_188 = ZEXT416((uint)fVar13);
  if (fVar12 < 0.0) {
    fVar12 = sqrtf(fVar12);
  }
  else {
    fVar12 = SQRT(fVar12);
  }
  fVar13 = fVar12 * fVar12 * _paddingPct;
  local_168.super_BoundingBox.min.field_0.x = local_168.super_BoundingBox.min.field_0.x - fVar13;
  local_168.super_BoundingBox.min.field_1.y = local_168.super_BoundingBox.min.field_1.y - fVar13;
  local_168.super_BoundingBox.min.field_2.z = local_168.super_BoundingBox.min.field_2.z - fVar13;
  local_168.super_BoundingBox.max.field_0.x = local_168.super_BoundingBox.max.field_0.x + fVar13;
  local_168.super_BoundingBox.max.field_1.y = local_168.super_BoundingBox.max.field_1.y + fVar13;
  local_168.super_BoundingBox.max.field_2.z = fVar13 + local_168.super_BoundingBox.max.field_2.z;
  dVar1 = ldexp(1.0,_resolution);
  local_1b8._8_4_ = extraout_XMM0_Dc;
  local_1b8._0_8_ = dVar1;
  local_1b8._12_4_ = extraout_XMM0_Dd;
  dVar2 = (double)(int)dVar1;
  local_e8 = CONCAT44((int)(double)CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc),(int)dVar1);
  uStack_e0 = 0;
  if (dVar2 < 0.0) {
    dVar2 = ::sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  Image::Image(__return_storage_ptr__);
  iVar10 = (int)(double)local_1b8._0_8_;
  _width = (size_t)((int)dVar2 * iVar10);
  local_1b8._0_8_ = __return_storage_ptr__;
  Image::allocate(__return_storage_ptr__,_width,_width,1);
  iVar6 = std::thread::hardware_concurrency();
  iVar3 = iVar10 / iVar6;
  iVar11 = iVar10 % iVar6;
  local_1a8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c0 = iVar10;
  if (0 < iVar6) {
    local_178._8_4_ = local_178._4_4_;
    local_178._4_4_ = local_188._0_4_;
    local_178._12_4_ = local_188._4_4_;
    local_188._0_4_ = 1.0 / (float)(int)local_e8;
    iVar10 = 0;
    do {
      local_1c8._M_id._M_thread = (id)0;
      local_1d0 = (long *)operator_new(0x40);
      iVar7 = 0;
      if (iVar6 == 1) {
        iVar7 = iVar11;
      }
      iVar8 = iVar3 + iVar10;
      *local_1d0 = (long)&PTR___State_003ec3e0;
      local_1d0[1] = (long)&local_168;
      local_1d0[2] = local_1b8._0_8_;
      *(int *)(local_1d0 + 3) = iVar10;
      *(int *)((long)local_1d0 + 0x1c) = iVar7 + iVar8;
      *(int *)(local_1d0 + 4) = local_1c0;
      *(undefined4 *)((long)local_1d0 + 0x24) = local_188._0_4_;
      *(int *)(local_1d0 + 5) = (int)dVar2;
      *(undefined8 *)((long)local_1d0 + 0x2c) = local_178._0_8_;
      *(float *)((long)local_1d0 + 0x34) = local_1bc;
      *(float *)(local_1d0 + 7) = fVar12 * 0.5;
      std::thread::_M_start_thread(&local_1c8,&local_1d0,0);
      if (local_1d0 != (long *)0x0) {
        (**(code **)(*local_1d0 + 8))();
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                (&local_1a8,&local_1c8);
      if (local_1c8._M_id._M_thread != 0) {
        std::terminate();
      }
      iVar6 = iVar6 + -1;
      iVar10 = iVar8;
    } while (iVar6 != 0);
  }
  ptVar5 = local_1a8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar4 = local_1b8._0_8_;
  for (ptVar9 = local_1a8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start; ptVar9 != ptVar5; ptVar9 = ptVar9 + 1) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_1a8);
  BVH::~BVH(&local_168);
  std::vector<vera::Triangle,_std::allocator<vera::Triangle>_>::~vector(&local_100);
  Mesh::~Mesh(&local_d8);
  return (Image *)uVar4;
}

Assistant:

Image   toSdf(const Mesh& _mesh, float _paddingPct, int _resolution) {
    Mesh mesh = _mesh;
    center(mesh);
    std::vector<Triangle> tris = mesh.getTriangles();
    BVH acc(tris, vera::SPLIT_MIDPOINT);

    acc.square();

    glm::vec3   bdiagonal   = acc.getDiagonal();
    float       max_dist    = glm::length(bdiagonal);
    acc.expand( (max_dist*max_dist) * _paddingPct );

    int    voxel_resolution = std::pow(2, _resolution);
    float        voxel_size = 1.0/float(voxel_resolution);
    int         layersTotal = std::sqrt(voxel_resolution);
    int    image_resolution = voxel_resolution * layersTotal;

    Image rta;
    rta.allocate(image_resolution, image_resolution, 1);

    const int nThreads  = std::thread::hardware_concurrency();
    int layersPerThread = voxel_resolution / nThreads;
    int layersLeftOver  = voxel_resolution % nThreads;
    max_dist *= 0.5f;

    std::vector<std::thread> threads;
    for (int i = 0; i < nThreads; ++i) {
        int start_layer = i * layersPerThread;
        int end_layer = start_layer + layersPerThread;
        if (i == nThreads - 1)
            end_layer = start_layer + layersPerThread + layersLeftOver;

        std::thread t(
            [&acc, &rta, start_layer, end_layer, voxel_resolution, voxel_size, layersTotal, bdiagonal, max_dist ]() {
                for (int z = start_layer; z < end_layer; z++)
                for (int y = 0; y < voxel_resolution; y++)
                for (int x = 0; x < voxel_resolution; x++) {
                    // for each voxel convert it into a point in the space containing a mesh
                    glm::vec3 p = glm::vec3(x, y, z) * voxel_size;
                    p = acc.min + p * bdiagonal;

                    glm::vec4 c = acc.getClosestRGBSignedDistance(p);
                    c.a = glm::clamp(c.a/max_dist, -1.0f, 1.0f) * 0.5 + 0.5;

                    size_t layerX = (z % layersTotal) * voxel_resolution; 
                    size_t layerY = floor(z / layersTotal) * voxel_resolution;
                    rta.setColor(rta.getIndex(layerX + x, layerY + y), c);
                }
            }
        );
        threads.push_back(std::move(t));
    }

    for (std::thread& t : threads)
        t.join();

    return rta;
}